

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O0

void __thiscall Simulator::jump_zero(Simulator *this,PCode *code)

{
  string *__k;
  mapped_type *pmVar1;
  reference pvVar2;
  int *piVar3;
  undefined1 local_68 [8];
  StackSymbol symbol;
  int target;
  PCode *code_local;
  Simulator *this_local;
  
  __k = PCode::first_abi_cxx11_(code);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->label_table_,__k);
  symbol.value_.real_array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = *pmVar1;
  pvVar2 = std::deque<StackSymbol,_std::allocator<StackSymbol>_>::back(&this->stack_);
  StackSymbol::StackSymbol((StackSymbol *)local_68,pvVar2);
  std::deque<StackSymbol,_std::allocator<StackSymbol>_>::pop_back(&this->stack_);
  piVar3 = StackSymbol::int_value((StackSymbol *)local_68);
  if (*piVar3 == 0) {
    set_eip(this,(int *)((long)&symbol.value_.real_array.
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
  }
  else {
    inc_eip(this);
  }
  StackSymbol::~StackSymbol((StackSymbol *)local_68);
  return;
}

Assistant:

void Simulator::jump_zero(const PCode &code) {
    int target = label_table_[code.first()];
    StackSymbol symbol = stack_.back();
    stack_.pop_back();
    if (symbol.int_value() == 0) {
        set_eip(target);
    } else {
        inc_eip();
    }
}